

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::UaddCarryCase::compare(UaddCarryCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  uint uVar2;
  pointer pSVar3;
  long lVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  ostringstream *this_00;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  Hex<8UL> local_38;
  
  pSVar3 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  bVar13 = true;
  if (0 < (int)uVar5) {
    uVar7 = (2 << ((&DAT_0096b0b0)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1;
    uVar10 = **inputs;
    uVar2 = *inputs[1];
    uVar8 = uVar2 + uVar10;
    lVar11 = (ulong)uVar2 + (ulong)uVar10;
    uVar10 = (uint)((ulong)lVar11 >> 0x20);
    if (((**outputs ^ uVar8) & uVar7) == 0) {
      bVar13 = false;
      uVar9 = 0;
      do {
        uVar10 = (uint)((ulong)lVar11 >> 0x20);
        uVar12 = uVar9;
        if (*(uint *)((long)outputs[1] + uVar9 * 4) != uVar10) break;
        if ((ulong)uVar5 - 1 == uVar9) {
          return true;
        }
        uVar12 = uVar9 + 1;
        bVar13 = uVar5 <= uVar12;
        uVar10 = *(uint *)((long)*inputs + (uVar9 + 1) * 4);
        uVar2 = *(uint *)((long)inputs[1] + (uVar9 + 1) * 4);
        uVar8 = uVar2 + uVar10;
        lVar11 = (ulong)uVar2 + (ulong)uVar10;
        uVar10 = (uint)((ulong)lVar11 >> 0x20);
        lVar4 = uVar9 + 1;
        uVar9 = uVar12;
      } while (((*(uint *)((long)*outputs + lVar4 * 4) ^ uVar8) & uVar7) == 0);
    }
    else {
      bVar13 = false;
      uVar12 = 0;
    }
    this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    poVar6 = (ostream *)std::ostream::operator<<(this_00,(int)uVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
    local_38.value = (deUint64)uVar8;
    poVar6 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    local_38.value = (deUint64)uVar10;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar6);
  }
  return bVar13;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask0			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint32	ref0	= in0+in1;
			const deUint32	ref1	= (deUint64(in0)+deUint64(in1)) > 0xffffffffu ? 1u : 0u;

			if (((out0&mask0) != (ref0&mask0)) || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}